

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O0

llama_memory_i * __thiscall llama_model::create_memory(llama_model *this)

{
  callbacks *pcVar1;
  callbacks *pcVar2;
  llama_hparams *hparams;
  long in_RDI;
  llama_memory_i *res;
  nullptr_t in_stack_ffffffffffffff48;
  function<ggml_tensor_*(unsigned_int,_int)> *in_stack_ffffffffffffff50;
  llama_hparams *in_stack_ffffffffffffff58;
  llama_kv_cache_unified *in_stack_ffffffffffffff60;
  llama_kv_cache_unified *this_00;
  undefined1 local_3d;
  callbacks *local_10;
  
  if ((*(int *)(in_RDI + 4) == 0x24) || (*(int *)(in_RDI + 4) - 0x38U < 4)) {
    pcVar1 = (callbacks *)operator_new(0xf8);
    local_3d = 1;
    std::function<ggml_tensor_*(unsigned_int,_int)>::function
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    llama_kv_cache_unified::llama_kv_cache_unified
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
               (callbacks *)in_stack_ffffffffffffff50);
    local_3d = 0;
    local_10 = pcVar1;
    llama_kv_cache_unified::callbacks::~callbacks((callbacks *)0x4a62a1);
  }
  else {
    pcVar2 = (callbacks *)operator_new(0xf8);
    hparams = (llama_hparams *)(in_RDI + 0x28);
    this_00 = (llama_kv_cache_unified *)&stack0xffffffffffffffa0;
    pcVar1 = pcVar2;
    std::function<ggml_tensor*(unsigned_int,int)>::
    function<llama_model::create_memory()const::__0,void>
              ((function<ggml_tensor_*(unsigned_int,_int)> *)this_00,
               (anon_class_8_1_8991fb9c *)hparams);
    llama_kv_cache_unified::llama_kv_cache_unified(this_00,hparams,pcVar1);
    local_10 = pcVar2;
    llama_kv_cache_unified::callbacks::~callbacks((callbacks *)0x4a6357);
  }
  return (llama_memory_i *)local_10;
}

Assistant:

llama_memory_i * llama_model::create_memory() const {
    llama_memory_i * res;

    switch (arch) {
        case LLM_ARCH_MAMBA:
        case LLM_ARCH_RWKV6:
        case LLM_ARCH_RWKV6QWEN2:
        case LLM_ARCH_RWKV7:
        case LLM_ARCH_ARWKV7:
            {
                res = new llama_kv_cache_unified(hparams, {
                    /*.get_rope_factors =*/ nullptr
                });
            } break;
        default:
            {
                res = new llama_kv_cache_unified(hparams, {
                    /*.get_rope_factors =*/ [this](uint32_t n_ctx_per_seq, int il) {
                        // choose long/short freq factors based on the context size
                        if (layers[il].rope_freqs != nullptr) {
                            return layers[il].rope_freqs;
                        }

                        if (n_ctx_per_seq > hparams.n_ctx_orig_yarn) {
                            return layers[il].rope_long;
                        }

                        return layers[il].rope_short;
                    }
                });
            }
    }

    return res;
}